

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

string * __thiscall
google::anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *flagval,
          FlagSettingMode set_mode,bool errors_are_fatal)

{
  size_type sVar1;
  char *name;
  int iVar2;
  CommandLineFlag *flag;
  undefined8 *puVar3;
  char *__s;
  long *plVar4;
  mapped_type *pmVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  undefined7 in_register_00000081;
  ulong uVar12;
  long lVar13;
  string envval;
  string envname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flaglist;
  string local_140;
  allocator local_119;
  key_type local_118;
  key_type local_f8;
  string *local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d0;
  CommandLineFlagParser *local_c8;
  key_type local_c0;
  FlagSettingMode local_a0;
  undefined4 local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  key_type local_50;
  
  local_9c = (undefined4)CONCAT71(in_register_00000081,errors_are_fatal);
  local_80 = &__return_storage_ptr__->field_2;
  sVar1 = flagval->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  local_d8 = __return_storage_ptr__;
  local_c8 = this;
  local_a0 = set_mode;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ParseFlagList((flagval->_M_dataplus)._M_p,&local_98);
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_d0 = &local_c8->error_flags_;
      local_78 = &local_c8->undefined_names_;
      lVar13 = 0;
      uVar12 = 0;
      do {
        name = *(char **)((long)&((local_98.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar13);
        flag = FlagRegistry::FindFlagLocked(local_c8->registry_,name);
        if (flag == (CommandLineFlag *)0x0) {
          StringPrintf_abi_cxx11_
                    (&local_f8,
                     "%sunknown command line flag \'%s\' (via --fromenv or --tryfromenv)\n",
                     "ERROR: ",name);
          std::__cxx11::string::string((string *)&local_118,name,(allocator *)&local_140);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_d0,&local_118);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          std::__cxx11::string::string((string *)&local_f8,name,(allocator *)&local_118);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_78,&local_f8);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x19b57b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_001935f7;
        }
        else {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"FLAGS_","");
          std::__cxx11::string::string((string *)&local_140,name,(allocator *)&local_c0);
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            uVar9 = CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]);
          }
          if (uVar9 < local_140._M_string_length + local_118._M_string_length) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              uVar10 = local_140.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_140._M_string_length + local_118._M_string_length)
            goto LAB_001931a1;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_140,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
          }
          else {
LAB_001931a1:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_118,(ulong)local_140._M_dataplus._M_p);
          }
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          psVar7 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f8.field_2._M_allocated_capacity = *psVar7;
            local_f8.field_2._8_8_ = puVar3[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar7;
            local_f8._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_f8._M_string_length = puVar3[1];
          *puVar3 = psVar7;
          puVar3[1] = 0;
          *(undefined1 *)psVar7 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          local_118._M_string_length = 0;
          local_118.field_2._M_local_buf[0] = '\0';
          __s = getenv(local_f8._M_dataplus._M_p);
          if (__s == (char *)0x0) {
LAB_001933b4:
            if ((char)local_9c != '\0') {
              local_70[0] = &local_60;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"ERROR: ","");
              plVar4 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_70,(ulong)local_f8._M_dataplus._M_p);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              psVar7 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_c0.field_2._M_allocated_capacity = *psVar7;
                local_c0.field_2._8_8_ = plVar4[3];
              }
              else {
                local_c0.field_2._M_allocated_capacity = *psVar7;
                local_c0._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_c0._M_string_length = plVar4[1];
              *plVar4 = (long)psVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              puVar8 = (ulong *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar8) {
                local_140.field_2._M_allocated_capacity = *puVar8;
                local_140.field_2._8_8_ = plVar4[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *puVar8;
                local_140._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_140._M_string_length = plVar4[1];
              *plVar4 = (long)puVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::__cxx11::string::string((string *)&local_50,name,&local_119);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](local_d0,&local_50);
              std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              paVar6 = &local_60;
              _Var11._M_p = (pointer)local_70[0];
              goto LAB_001935cf;
            }
          }
          else {
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)0x0,(ulong)__s);
            if (__s == (char *)0x0) goto LAB_001933b4;
            iVar2 = std::__cxx11::string::compare((char *)&local_118);
            if ((iVar2 == 0) ||
               (iVar2 = std::__cxx11::string::compare((char *)&local_118), iVar2 == 0)) {
              StringPrintf_abi_cxx11_
                        (&local_140,"%sinfinite recursion on environment flag \'%s\'\n","ERROR: ",
                         local_118._M_dataplus._M_p);
              std::__cxx11::string::string((string *)&local_c0,name,(allocator *)local_70);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](local_d0,&local_c0);
              std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
            }
            else {
              (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                        (&local_140,local_c8,flag,local_118._M_dataplus._M_p,local_a0);
              std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_140._M_dataplus._M_p);
            }
            paVar6 = &local_140.field_2;
            _Var11._M_p = local_140._M_dataplus._M_p;
LAB_001935cf:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var11._M_p != paVar6) {
              operator_delete(_Var11._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_001935f7:
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar12 < (ulong)((long)local_98.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_98.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  return local_d8;
}

Assistant:

string CommandLineFlagParser::ProcessFromenvLocked(const string& flagval,
                                                   FlagSettingMode set_mode,
                                                   bool errors_are_fatal) {
  if (flagval.empty())
    return "";

  string msg;
  vector<string> flaglist;
  ParseFlagList(flagval.c_str(), &flaglist);

  for (size_t i = 0; i < flaglist.size(); ++i) {
    const char* flagname = flaglist[i].c_str();
    CommandLineFlag* flag = registry_->FindFlagLocked(flagname);
    if (flag == NULL) {
      error_flags_[flagname] =
          StringPrintf("%sunknown command line flag '%s' "
                       "(via --fromenv or --tryfromenv)\n",
                       kError, flagname);
      undefined_names_[flagname] = "";
      continue;
    }

    const string envname = string("FLAGS_") + string(flagname);
	string envval;
	if (!SafeGetEnv(envname.c_str(), envval)) {
      if (errors_are_fatal) {
        error_flags_[flagname] = (string(kError) + envname +
                                  " not found in environment\n");
      }
      continue;
    }

    // Avoid infinite recursion.
    if (envval == "fromenv" || envval == "tryfromenv") {
      error_flags_[flagname] =
          StringPrintf("%sinfinite recursion on environment flag '%s'\n",
                       kError, envval.c_str());
      continue;
    }

    msg += ProcessSingleOptionLocked(flag, envval.c_str(), set_mode);
  }
  return msg;
}